

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void ITransform_SSE2(uint8_t *ref,int16_t *in,uint8_t *dst,int do_two)

{
  int in_ECX;
  uint8_t *in_stack_00000368;
  int16_t *in_stack_00000370;
  uint8_t *in_stack_00000378;
  uint8_t *in_stack_00000398;
  int16_t *in_stack_000003a0;
  uint8_t *in_stack_000003a8;
  
  if (in_ECX == 0) {
    ITransform_One_SSE2(in_stack_00000378,in_stack_00000370,in_stack_00000368);
  }
  else {
    ITransform_Two_SSE2(in_stack_000003a8,in_stack_000003a0,in_stack_00000398);
  }
  return;
}

Assistant:

static void ITransform_SSE2(const uint8_t* WEBP_RESTRICT ref,
                            const int16_t* WEBP_RESTRICT in,
                            uint8_t* WEBP_RESTRICT dst,
                            int do_two) {
  if (do_two) {
    ITransform_Two_SSE2(ref, in, dst);
  } else {
    ITransform_One_SSE2(ref, in, dst);
  }
}